

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O1

CURLcode Curl_md5it(uchar *outbuffer,uchar *input,size_t len)

{
  int iVar1;
  uint uVar2;
  CURLcode CVar3;
  my_md5_ctx ctx;
  MD5_CTX local_74;
  
  iVar1 = MD5_Init(&local_74);
  if (iVar1 == 0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    uVar2 = curlx_uztoui(len);
    MD5_Update(&local_74,input,(ulong)uVar2);
    MD5_Final(outbuffer,&local_74);
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_md5it(unsigned char *outbuffer, const unsigned char *input,
                    const size_t len)
{
  CURLcode result;
  my_md5_ctx ctx;

  result = my_md5_init(&ctx);
  if(!result) {
    my_md5_update(&ctx, input, curlx_uztoui(len));
    my_md5_final(outbuffer, &ctx);
  }
  return result;
}